

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O2

void TCLAP::ExtractValue<int>(int *destVal,string *strVal,ValueLike *vl)

{
  int iVar1;
  long lVar2;
  ArgParseException *pAVar3;
  uint uVar4;
  allocator local_201;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  istringstream is;
  byte abStack_180 [352];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)strVal,_S_in);
  uVar4 = 0;
  do {
    lVar2 = *(long *)(_is + -0x18);
    if (*(int *)(abStack_180 + lVar2) != 0) {
LAB_0012e313:
      if ((abStack_180[lVar2] & 5) != 0) {
        pAVar3 = (ArgParseException *)__cxa_allocate_exception(0x68);
        std::operator+(&local_1e0,"Couldn\'t read argument value from string \'",strVal);
        std::operator+(&local_1c0,&local_1e0,"\'");
        std::__cxx11::string::string((string *)&local_200,"undefined",&local_201);
        ArgParseException::ArgParseException(pAVar3,&local_1c0,&local_200);
        __cxa_throw(pAVar3,&ArgParseException::typeinfo,ArgException::~ArgException);
      }
      if (uVar4 < 2) {
        std::__cxx11::istringstream::~istringstream((istringstream *)&is);
        return;
      }
      pAVar3 = (ArgParseException *)__cxa_allocate_exception(0x68);
      std::operator+(&local_1e0,"More than one valid value parsed from string \'",strVal);
      std::operator+(&local_1c0,&local_1e0,"\'");
      std::__cxx11::string::string((string *)&local_200,"undefined",&local_201);
      ArgParseException::ArgParseException(pAVar3,&local_1c0,&local_200);
      __cxa_throw(pAVar3,&ArgParseException::typeinfo,ArgException::~ArgException);
    }
    iVar1 = std::istream::peek();
    if (iVar1 == -1) {
      lVar2 = *(long *)(_is + -0x18);
      goto LAB_0012e313;
    }
    std::istream::operator>>((istream *)&is,destVal);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void
ExtractValue(T &destVal, const std::string& strVal, ValueLike vl)
{
    static_cast<void>(vl); // Avoid warning about unused vl
    std::istringstream is(strVal);

    int valuesRead = 0;
    while ( is.good() ) {
	if ( is.peek() != EOF )
#ifdef TCLAP_SETBASE_ZERO
	    is >> std::setbase(0) >> destVal;
#else
	    is >> destVal;
#endif
	else
	    break;

	valuesRead++;
    }

    if ( is.fail() )
	throw( ArgParseException("Couldn't read argument value "
				 "from string '" + strVal + "'"));


    if ( valuesRead > 1 )
	throw( ArgParseException("More than one valid value parsed from "
				 "string '" + strVal + "'"));

}